

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpsClient.cpp
# Opt level: O0

void __thiscall xmrig::HttpsClient::flush(HttpsClient *this)

{
  int iVar1;
  uv_stream_t *puVar2;
  HttpContext *in_RDI;
  bool result;
  uv_buf_t buf;
  undefined1 local_18 [8];
  long local_10;
  
  local_10 = BIO_ctrl((BIO *)in_RDI[1].super_HttpData.headers._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_left,3,0,local_18);
  if (local_10 != 0) {
    puVar2 = HttpContext::stream(in_RDI);
    iVar1 = uv_is_writable(puVar2);
    if (iVar1 != 0) {
      puVar2 = HttpContext::stream(in_RDI);
      iVar1 = uv_try_write(puVar2,local_18,1);
      if (iVar1 != (int)local_10) {
        HttpContext::close(in_RDI,-5);
      }
    }
    BIO_ctrl((BIO *)in_RDI[1].super_HttpData.headers._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left,1,0,(void *)0x0);
  }
  return;
}

Assistant:

void xmrig::HttpsClient::flush()
{
    uv_buf_t buf;
    buf.len = BIO_get_mem_data(m_writeBio, &buf.base);

    if (buf.len == 0) {
        return;
    }

    bool result = false;
    if (uv_is_writable(stream())) {
        result = uv_try_write(stream(), &buf, 1) == static_cast<int>(buf.len);

        if (!result) {
            close(UV_EIO);
        }
    }

    (void) BIO_reset(m_writeBio);
}